

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall cpptempl::data_ptr::operator=(data_ptr *this,string *data)

{
  DataValue *__p;
  string *in_RSI;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffc4;
  string local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  __p = (DataValue *)operator_new(0x28);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  std::__cxx11::string::string(local_30,local_10);
  DataValue::DataValue((DataValue *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),(string *)__p);
  std::__shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>::reset<cpptempl::DataValue>
            ((__shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2> *)
             (CONCAT44(in_stack_ffffffffffffffc4,uVar1) & 0xffffffff00ffffff),__p);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

inline void data_ptr::operator = (const std::string& data) {
        ptr.reset(new DataValue(data));
    }